

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

void cptp_sighandler(int signum)

{
  long lVar1;
  char *fmt;
  int line;
  long in_FS_OFFSET;
  
  if (signum == 0xf) {
    fmt = "Received SIGTERM";
    line = 0x1a7;
  }
  else {
    if (signum != 2) goto LAB_00105a4a;
    fmt = "Received SIGINT";
    line = 0x1a4;
  }
  log_log(0x40,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
          ,line,fmt);
LAB_00105a4a:
  lVar1 = *(long *)(in_FS_OFFSET + -8);
  if (lVar1 != 0 && (signum == 2 || signum == 0xf)) {
    *(undefined1 *)(lVar1 + 8) = 1;
    *(undefined4 *)(lVar1 + 0xc) = 1;
  }
  return;
}

Assistant:

static void cptp_sighandler(int signum) {
    switch (signum) {
    case SIGINT:
        log_warn("Received SIGINT");
        break;
    case SIGTERM:
        log_warn("Received SIGTERM");
        break;
    default:
        break;
    }
    if (signum == SIGTERM || signum == SIGINT) {
        if (sighandler_ctx_solver_ptr) {
            sighandler_ctx_solver_ptr->sigterm_occured = true;
            sighandler_ctx_solver_ptr->sigterm_occured_int = 1;
        }
    }
}